

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.cpp
# Opt level: O0

void __thiscall Move::Move(Move *this,Position *initialPosition,NurseSolution *movedNurse)

{
  allocator local_41;
  string local_40;
  NurseSolution *local_20;
  NurseSolution *movedNurse_local;
  Position *initialPosition_local;
  Move *this_local;
  
  local_20 = movedNurse;
  movedNurse_local = (NurseSolution *)initialPosition;
  initialPosition_local = &this->initialPosition;
  Position::Position(&this->initialPosition,initialPosition);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"",&local_41);
  Position::Position(&this->lastPosition,-1,(ShiftType *)0x0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this->movedNurse = local_20;
  this->tradedNurse = (NurseSolution *)0x0;
  return;
}

Assistant:

Move::Move(Position initialPosition, NurseSolution* movedNurse) : initialPosition(initialPosition), movedNurse(movedNurse){}